

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void init_test_get(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                  context *ctx)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  uint local_44;
  ulong uStack_40;
  uint i;
  unsigned_long_long n_key;
  uint n;
  int cache_is_full;
  context *ctx_local;
  os_thread_t *poStack_20;
  uint ops_per_thread_local;
  os_thread_t *threads_local;
  VMEMcache *pVStack_10;
  uint n_threads_local;
  VMEMcache *cache_local;
  
  _n = ctx;
  ctx_local._4_4_ = ops_per_thread;
  poStack_20 = threads;
  threads_local._4_4_ = n_threads;
  pVStack_10 = cache;
  free_cache(cache);
  n_key._4_4_ = 0;
  vmemcache_callback_on_evict(pVStack_10,on_evict_cb,(long)&n_key + 4);
  printf("%s: filling the pool...","init_test_get");
  fflush(_stdout);
  n_key._0_4_ = 0;
  while( true ) {
    if (n_key._4_4_ != 0 || ctx_local._4_4_ <= (uint)n_key) {
      printf(" done (inserted %u elements)\n",(ulong)(uint)n_key);
      vmemcache_callback_on_evict(pVStack_10,0);
      if ((uint)n_key < ctx_local._4_4_) {
        ctx_local._4_4_ = (uint)n_key;
        printf("%s: decreasing ops_count to: %u\n","init_test_get",
               (ulong)(threads_local._4_4_ * (uint)n_key));
      }
      for (local_44 = 0; local_44 < threads_local._4_4_; local_44 = local_44 + 1) {
        _n[local_44].worker = worker_thread_get;
        _n[local_44].ops_count = ctx_local._4_4_;
      }
      return;
    }
    uStack_40 = (ulong)(uint)n_key;
    iVar1 = vmemcache_put(pVStack_10,&stack0xffffffffffffffc0,8,
                          _n->buffs[(ulong)(uint)n_key % (ulong)_n->nbuffs].buff,
                          _n->buffs[(ulong)(uint)n_key % (ulong)_n->nbuffs].size);
    if (iVar1 != 0) break;
    n_key._0_4_ = (uint)n_key + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0xdf,"init_test_get");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void
init_test_get(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx)
{
	free_cache(cache);

	int cache_is_full = 0;
	vmemcache_callback_on_evict(cache, on_evict_cb, &cache_is_full);

	printf("%s: filling the pool...", __func__);
	fflush(stdout);

	unsigned n = 0; /* number of elements put into the cache */
	while (!cache_is_full && n < ops_per_thread) {
		unsigned long long n_key = n;
		if (vmemcache_put(cache, &n_key, sizeof(n_key),
					ctx->buffs[n % ctx->nbuffs].buff,
					ctx->buffs[n % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
		n++;
	}

	printf(" done (inserted %u elements)\n", n);

	vmemcache_callback_on_evict(cache, NULL, NULL);

	if (ops_per_thread > n) {
		/* we cannot get more than we have put */
		ops_per_thread = n;
		printf("%s: decreasing ops_count to: %u\n",
			__func__, n_threads * ops_per_thread);
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_get;
		ctx[i].ops_count = ops_per_thread;
	}
}